

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O2

int __thiscall glslang::TInputScanner::get(TInputScanner *this)

{
  int *piVar1;
  int iVar2;
  TSourceLoc *pTVar3;
  int iVar4;
  
  iVar4 = peek(this);
  if (iVar4 != -1) {
    pTVar3 = this->loc;
    iVar2 = this->currentSource;
    pTVar3[iVar2].column = pTVar3[iVar2].column + 1;
    piVar1 = &(this->logicalSourceLoc).column;
    *piVar1 = *piVar1 + 1;
    if (iVar4 == 10) {
      pTVar3[iVar2].line = pTVar3[iVar2].line + 1;
      piVar1 = &(this->logicalSourceLoc).line;
      *piVar1 = *piVar1 + 1;
      (this->logicalSourceLoc).column = 0;
      pTVar3[iVar2].column = 0;
    }
    advance(this);
  }
  return iVar4;
}

Assistant:

int get()
    {
        int ret = peek();
        if (ret == EndOfInput)
            return ret;
        ++loc[currentSource].column;
        ++logicalSourceLoc.column;
        if (ret == '\n') {
            ++loc[currentSource].line;
            ++logicalSourceLoc.line;
            logicalSourceLoc.column = 0;
            loc[currentSource].column = 0;
        }
        advance();

        return ret;
    }